

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

void __thiscall
ON_Layer::SetPerViewportColor(ON_Layer *this,ON_UUID viewport_id,ON_Color layer_color)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ON__LayerPerViewSettings *this_00;
  undefined1 in_R9B;
  ON_UUID viewport_id_00;
  ON__LayerPerViewSettings *vp_settings;
  bool bSet;
  ON_Layer *this_local;
  uchar *puStack_18;
  ON_Color layer_color_local;
  ON_UUID viewport_id_local;
  
  puStack_18 = viewport_id._0_8_;
  this_local._4_4_ = layer_color.field_0;
  bVar1 = ON_UuidIsNil((ON_UUID *)&stack0xffffffffffffffe8);
  if (bVar1) {
    DeletePerViewportColor(this,(ON_UUID *)&stack0xffffffffffffffe8);
    uVar3 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
    uVar2 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)((long)&this_local + 4));
    if (uVar3 != uVar2) {
      (this->m_color).field_0 = this_local._4_4_;
    }
  }
  else {
    uVar3 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)((long)&this_local + 4));
    viewport_id_00.Data4[0] = uVar3 != 0xffffffff;
    viewport_id_00._0_8_ = viewport_id.Data4;
    viewport_id_00.Data4[1] = '\0';
    viewport_id_00.Data4[2] = '\0';
    viewport_id_00.Data4[3] = '\0';
    viewport_id_00.Data4[4] = '\0';
    viewport_id_00.Data4[5] = '\0';
    viewport_id_00.Data4[6] = '\0';
    viewport_id_00.Data4[7] = '\0';
    this_00 = ON__LayerExtensions::ViewportSettings
                        ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,puStack_18,
                         viewport_id_00,(bool)in_R9B);
    if (((this_00 != (ON__LayerPerViewSettings *)0x0) &&
        ((this_00->m_color).field_0 = this_local._4_4_, uVar3 == 0xffffffff)) &&
       (uVar3 = ON__LayerPerViewSettings::SettingsMask(this_00), uVar3 == 0)) {
      ON__LayerExtensions::DeleteViewportSettings(this,&this->m_extension_bits,this_00);
    }
  }
  return;
}

Assistant:

void ON_Layer::SetPerViewportColor( ON_UUID viewport_id, ON_Color layer_color )
{
  if ( ON_UuidIsNil(viewport_id) )
  {
    DeletePerViewportColor(viewport_id);
    if ( ON_Color::UnsetColor != layer_color )
      m_color = layer_color;
  }
  else
  {
    bool bSet = ( layer_color != ON_UNSET_COLOR );
    ON__LayerPerViewSettings* vp_settings = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, viewport_id, bSet );
    if ( vp_settings )
    {
      vp_settings->m_color = layer_color;
      if ( !bSet && 0 == vp_settings->SettingsMask() )
        ON__LayerExtensions::DeleteViewportSettings(*this, &m_extension_bits, vp_settings);
    }
  }
}